

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_psraw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  byte bVar1;
  
  bVar1 = 0xf;
  if (s->_q_MMXReg[0] < 0x10) {
    bVar1 = s->_b_MMXReg[0];
  }
  d->_w_MMXReg[0] = (uint16_t)((int)(short)d->_w_MMXReg[0] >> (bVar1 & 0x1f));
  d->_w_MMXReg[1] = (uint16_t)((int)(short)d->_w_MMXReg[1] >> (bVar1 & 0x1f));
  d->_w_MMXReg[2] = (uint16_t)((int)(short)d->_w_MMXReg[2] >> (bVar1 & 0x1f));
  d->_w_MMXReg[3] = (uint16_t)((int)(short)d->_w_MMXReg[3] >> (bVar1 & 0x1f));
  return;
}

Assistant:

void glue(helper_psraw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 15) {
        shift = 15;
    } else {
        shift = s->B(0);
    }
    d->W(0) = (int16_t)d->W(0) >> shift;
    d->W(1) = (int16_t)d->W(1) >> shift;
    d->W(2) = (int16_t)d->W(2) >> shift;
    d->W(3) = (int16_t)d->W(3) >> shift;
#if SHIFT == 1
    d->W(4) = (int16_t)d->W(4) >> shift;
    d->W(5) = (int16_t)d->W(5) >> shift;
    d->W(6) = (int16_t)d->W(6) >> shift;
    d->W(7) = (int16_t)d->W(7) >> shift;
#endif
}